

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

bool __thiscall Gluco::DoubleOption::parse(DoubleOption *this,char *str)

{
  double dVar1;
  char *pcVar2;
  long lVar3;
  undefined1 extraout_AL;
  long lVar4;
  char cVar5;
  char **ppcVar6;
  bool bVar7;
  double dVar8;
  char *end;
  char *local_20;
  
  if (*str != '-') {
    return false;
  }
  pcVar2 = (this->super_Option).name;
  lVar4 = 0;
  cVar5 = *pcVar2;
  while (cVar5 != '\0') {
    if (str[lVar4 + 1] != cVar5) {
      return false;
    }
    lVar3 = lVar4 + 1;
    lVar4 = lVar4 + 1;
    cVar5 = pcVar2[lVar3];
  }
  if (str[lVar4 + 1] != '=') {
    return false;
  }
  dVar8 = strtod(str + lVar4 + 2,&local_20);
  bVar7 = local_20 != (char *)0x0;
  if (!bVar7) {
    return bVar7;
  }
  ppcVar6 = &(this->super_Option).name;
  dVar1 = (this->range).end;
  if (dVar8 < dVar1) {
LAB_005c56cf:
    dVar1 = (this->range).begin;
    if (dVar1 < dVar8) {
LAB_005c56ea:
      this->value = dVar8;
      return bVar7;
    }
    if ((this->range).begin_inclusive == true) {
      if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) goto LAB_005c56ea;
    }
  }
  else {
    if ((this->range).end_inclusive == true) {
      if ((dVar8 == dVar1) && (!NAN(dVar8) && !NAN(dVar1))) goto LAB_005c56cf;
    }
    parse();
  }
  parse();
  operator_delete(ppcVar6,0x38);
  return (bool)extraout_AL;
}

Assistant:

DoubleOption(const char* c, const char* n, const char* d, double def = double(), DoubleRange r = DoubleRange(-HUGE_VAL, false, HUGE_VAL, false))
        : Option(n, d, c, "<double>"), range(r), value(def) {
        // FIXME: set LC_NUMERIC to "C" to make sure that strtof/strtod parses decimal point correctly.
    }